

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

_Bool al_set_path_extension(ALLEGRO_PATH *path,char *extension)

{
  int iVar1;
  size_t sVar2;
  long in_RDI;
  int32_t unaff_retaddr;
  int unaff_retaddr_00;
  ALLEGRO_USTR *in_stack_00000008;
  int dot;
  char *s;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  sVar2 = al_ustr_size(*(ALLEGRO_USTR **)(in_RDI + 8));
  if (sVar2 == 0) {
    local_1 = false;
  }
  else {
    s = *(char **)(in_RDI + 8);
    al_ustr_size(*(ALLEGRO_USTR **)(in_RDI + 8));
    iVar1 = al_ustr_rfind_chr(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    if (-1 < iVar1) {
      al_ustr_truncate((ALLEGRO_USTR *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                       (int)((ulong)s >> 0x20));
    }
    al_ustr_append_cstr((ALLEGRO_USTR *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),s);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool al_set_path_extension(ALLEGRO_PATH *path, char const *extension)
{
   int dot;
   ASSERT(path);

   if (al_ustr_size(path->filename) == 0) {
      return false;
   }

   dot = al_ustr_rfind_chr(path->filename, al_ustr_size(path->filename), '.');
   if (dot >= 0) {
      al_ustr_truncate(path->filename, dot);
   }
   al_ustr_append_cstr(path->filename, extension);
   return true;
}